

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics_propagator.cpp
# Opt level: O3

unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true> __thiscall
duckdb::StatisticsPropagator::PropagateStatistics
          (StatisticsPropagator *this,LogicalOperator *node,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *node_ptr)

{
  byte bVar1;
  Optimizer *optimizer_p;
  bool bVar2;
  LogicalProjection *node_ptr_00;
  LogicalGet *node_ptr_01;
  LogicalFilter *node_ptr_02;
  LogicalWindow *node_ptr_03;
  LogicalAggregate *node_ptr_04;
  LogicalOrder *node_ptr_05;
  LogicalCrossProduct *node_ptr_06;
  LogicalPositionalJoin *node_ptr_07;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *in_RCX;
  CompressedMaterialization compressed_materialization;
  Optimizer *local_48;
  
  bVar1 = *(byte *)&node_ptr[1].
                    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                    ._M_t.
                    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  if (bVar1 < 0x32) {
    switch(bVar1) {
    case 1:
      node_ptr_00 = LogicalOperator::Cast<duckdb::LogicalProjection>((LogicalOperator *)node_ptr);
      PropagateStatistics((StatisticsPropagator *)&stack0xffffffffffffffb8,(LogicalProjection *)node
                          ,(unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                            *)node_ptr_00);
      break;
    case 2:
      node_ptr_02 = LogicalOperator::Cast<duckdb::LogicalFilter>((LogicalOperator *)node_ptr);
      PropagateStatistics((StatisticsPropagator *)&stack0xffffffffffffffb8,(LogicalFilter *)node,
                          (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                           *)node_ptr_02);
      break;
    case 3:
      node_ptr_04 = LogicalOperator::Cast<duckdb::LogicalAggregate>((LogicalOperator *)node_ptr);
      PropagateStatistics((StatisticsPropagator *)&stack0xffffffffffffffb8,(LogicalAggregate *)node,
                          (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                           *)node_ptr_04);
      break;
    case 4:
      node_ptr_03 = LogicalOperator::Cast<duckdb::LogicalWindow>((LogicalOperator *)node_ptr);
      PropagateStatistics((StatisticsPropagator *)&stack0xffffffffffffffb8,(LogicalWindow *)node,
                          (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                           *)node_ptr_03);
      break;
    case 7:
      node_ptr_05 = LogicalOperator::Cast<duckdb::LogicalOrder>((LogicalOperator *)node_ptr);
      PropagateStatistics((StatisticsPropagator *)&stack0xffffffffffffffb8,(LogicalOrder *)node,
                          (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                           *)node_ptr_05);
      break;
    default:
      if (bVar1 == 0x19) {
        node_ptr_01 = LogicalOperator::Cast<duckdb::LogicalGet>((LogicalOperator *)node_ptr);
        PropagateStatistics((StatisticsPropagator *)&stack0xffffffffffffffb8,(LogicalGet *)node,
                            (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                             *)node_ptr_01);
        break;
      }
    case 5:
    case 6:
switchD_011745d6_caseD_5:
      PropagateChildren((StatisticsPropagator *)&stack0xffffffffffffffb8,node,node_ptr);
    }
  }
  else {
    switch(bVar1) {
    case 0x32:
    case 0x33:
    case 0x34:
    case 0x35:
    case 0x38:
      PropagateStatistics((StatisticsPropagator *)&stack0xffffffffffffffb8,(LogicalJoin *)node,
                          node_ptr);
      break;
    case 0x36:
      node_ptr_06 = LogicalOperator::Cast<duckdb::LogicalCrossProduct>((LogicalOperator *)node_ptr);
      PropagateStatistics((StatisticsPropagator *)&stack0xffffffffffffffb8,
                          (LogicalCrossProduct *)node,
                          (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                           *)node_ptr_06);
      break;
    case 0x37:
      node_ptr_07 = LogicalOperator::Cast<duckdb::LogicalPositionalJoin>
                              ((LogicalOperator *)node_ptr);
      PropagateStatistics((StatisticsPropagator *)&stack0xffffffffffffffb8,
                          (LogicalPositionalJoin *)node,
                          (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                           *)node_ptr_07);
      break;
    default:
      if (bVar1 - 0x4b < 3) {
        PropagateStatistics((StatisticsPropagator *)&stack0xffffffffffffffb8,
                            (LogicalSetOperation *)node,node_ptr);
        break;
      }
      goto switchD_011745d6_caseD_5;
    }
  }
  this->optimizer = local_48;
  bVar2 = Optimizer::OptimizerDisabled
                    ((ClientContext *)*node->_vptr_LogicalOperator,COMPRESSED_MATERIALIZATION);
  if (!bVar2) {
    optimizer_p = (Optimizer *)node->_vptr_LogicalOperator;
    optional_ptr<duckdb::LogicalOperator,_true>::CheckValid
              ((optional_ptr<duckdb::LogicalOperator,_true> *)&node->children);
    CompressedMaterialization::CompressedMaterialization
              ((CompressedMaterialization *)&stack0xffffffffffffffb8,optimizer_p,
               (LogicalOperator *)
               (node->children).
               super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (statistics_map_t *)
               &(node->children).
                super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish);
    CompressedMaterialization::Compress
              ((CompressedMaterialization *)&stack0xffffffffffffffb8,in_RCX);
  }
  return (unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>)
         (unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>)this;
}

Assistant:

unique_ptr<NodeStatistics> StatisticsPropagator::PropagateStatistics(LogicalOperator &node,
                                                                     unique_ptr<LogicalOperator> &node_ptr) {
	unique_ptr<NodeStatistics> result;
	switch (node.type) {
	case LogicalOperatorType::LOGICAL_AGGREGATE_AND_GROUP_BY:
		result = PropagateStatistics(node.Cast<LogicalAggregate>(), node_ptr);
		break;
	case LogicalOperatorType::LOGICAL_CROSS_PRODUCT:
		result = PropagateStatistics(node.Cast<LogicalCrossProduct>(), node_ptr);
		break;
	case LogicalOperatorType::LOGICAL_FILTER:
		result = PropagateStatistics(node.Cast<LogicalFilter>(), node_ptr);
		break;
	case LogicalOperatorType::LOGICAL_GET:
		result = PropagateStatistics(node.Cast<LogicalGet>(), node_ptr);
		break;
	case LogicalOperatorType::LOGICAL_PROJECTION:
		result = PropagateStatistics(node.Cast<LogicalProjection>(), node_ptr);
		break;
	case LogicalOperatorType::LOGICAL_ANY_JOIN:
	case LogicalOperatorType::LOGICAL_ASOF_JOIN:
	case LogicalOperatorType::LOGICAL_COMPARISON_JOIN:
	case LogicalOperatorType::LOGICAL_JOIN:
	case LogicalOperatorType::LOGICAL_DELIM_JOIN:
		result = PropagateStatistics(node.Cast<LogicalJoin>(), node_ptr);
		break;
	case LogicalOperatorType::LOGICAL_POSITIONAL_JOIN:
		result = PropagateStatistics(node.Cast<LogicalPositionalJoin>(), node_ptr);
		break;
	case LogicalOperatorType::LOGICAL_UNION:
	case LogicalOperatorType::LOGICAL_EXCEPT:
	case LogicalOperatorType::LOGICAL_INTERSECT:
		result = PropagateStatistics(node.Cast<LogicalSetOperation>(), node_ptr);
		break;
	case LogicalOperatorType::LOGICAL_ORDER_BY:
		result = PropagateStatistics(node.Cast<LogicalOrder>(), node_ptr);
		break;
	case LogicalOperatorType::LOGICAL_WINDOW:
		result = PropagateStatistics(node.Cast<LogicalWindow>(), node_ptr);
		break;
	default:
		result = PropagateChildren(node, node_ptr);
	}

	if (!optimizer.OptimizerDisabled(OptimizerType::COMPRESSED_MATERIALIZATION)) {
		// compress data based on statistics for materializing operators
		CompressedMaterialization compressed_materialization(optimizer, *root, statistics_map);
		compressed_materialization.Compress(node_ptr);
	}

	return result;
}